

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void save_load(bfgs *b,io_buf *model_file,bool read,bool text)

{
  uint32_t uVar1;
  vw *all;
  int iVar2;
  float *pfVar3;
  double *pdVar4;
  long *plVar5;
  ostream *poVar6;
  vw_exception *this;
  undefined7 in_register_00000009;
  uint32_t *puVar7;
  int iVar8;
  undefined7 in_register_00000011;
  size_t nmemb;
  bool bVar9;
  bool reg_vector;
  stringstream __msg;
  char local_1de;
  undefined1 local_1dd;
  undefined4 local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1dc = (undefined4)CONCAT71(in_register_00000009,text);
  all = b->all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    local_1de = true;
    if (b->output_regularizer != false) goto LAB_001aad89;
  }
  else {
    uVar1 = all->num_bits;
    initialize_regressor(all);
    iVar2 = std::__cxx11::string::compare((char *)&all->per_feature_regularizer_input);
    if (iVar2 != 0) {
      pfVar3 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)uVar1 & 0x1f)));
      b->regularizers = pfVar3;
      if (pfVar3 == (float *)0x0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Failed to allocate regularizers array: try decreasing -b <bits>",0x3f);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                   ,0x40a,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    iVar2 = b->m;
    nmemb = (size_t)iVar2;
    iVar8 = 1;
    if (nmemb != 0) {
      iVar8 = iVar2 * 2;
    }
    b->mem_stride = iVar8;
    pfVar3 = calloc_or_throw<float>((long)iVar8 << ((byte)all->num_bits & 0x3f));
    b->mem = pfVar3;
    pdVar4 = calloc_or_throw<double>(nmemb);
    b->rho = pdVar4;
    pdVar4 = calloc_or_throw<double>(nmemb);
    b->alpha = pdVar4;
    if (all->quiet == false) {
      puVar7 = &(all->weights).dense_weights._stride_shift;
      if ((all->weights).sparse != false) {
        puVar7 = &(all->weights).sparse_weights._stride_shift;
      }
      local_1dd = (undefined1)*puVar7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"m = ",4);
      plVar5 = (long *)std::ostream::operator<<(&std::cerr,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Allocated ",10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"M for weights and mem",0x15);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    b->net_time = 0.0;
    ftime(&b->t_start_global);
    if (all->quiet == false) {
      save_load();
    }
    if (b->regularizers != (weight *)0x0) {
      all->l2_lambda = 1.0;
    }
    iVar2 = std::__cxx11::string::compare((char *)&all->per_feature_regularizer_output);
    bVar9 = true;
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)&all->per_feature_regularizer_text);
      bVar9 = iVar2 != 0;
    }
    b->output_regularizer = bVar9;
    b->lastj = 0;
    b->origin = 0;
    b->loss_sum = 0.0;
    b->previous_loss_sum = 0.0;
    b->importance_weight_sum = 0.0;
    b->curvature = 0.0;
    b->first_pass = true;
    b->gradient_pass = true;
    b->preconditioner_pass = true;
  }
  local_1de = (all->per_feature_regularizer_input)._M_string_length != 0 && read;
LAB_001aad89:
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar6 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&local_1de,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&local_1de,1,(stringstream *)local_1b8,local_1dc._0_1_);
    }
    if (local_1de == '\x01') {
      save_load_regularizer(all,b,model_file,read,local_1dc._0_1_);
    }
    else {
      GD::save_load_regressor(all,model_file,read,local_1dc._0_1_);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load(bfgs& b, io_buf& model_file, bool read, bool text)
{
  vw* all = b.all;

  uint32_t length = 1 << all->num_bits;

  if (read)
  {
    initialize_regressor(*all);
    if (all->per_feature_regularizer_input != "")
    {
      b.regularizers = calloc_or_throw<weight>(2 * length);
      if (b.regularizers == nullptr)
        THROW("Failed to allocate regularizers array: try decreasing -b <bits>");
    }
    int m = b.m;

    b.mem_stride = (m == 0) ? CG_EXTRA : 2 * m;
    b.mem = calloc_or_throw<float>(all->length() * b.mem_stride);
    b.rho = calloc_or_throw<double>(m);
    b.alpha = calloc_or_throw<double>(m);

    uint32_t stride_shift = all->weights.stride_shift();

    if (!all->quiet)
      cerr << "m = " << m << endl
           << "Allocated "
           << ((long unsigned int)all->length() * (sizeof(float) * (b.mem_stride) + (sizeof(weight) << stride_shift)) >>
                  20)
           << "M for weights and mem" << endl;

    b.net_time = 0.0;
    ftime(&b.t_start_global);

    if (!all->quiet)
    {
      const char* header_fmt = "%2s %-10s\t%-10s\t%-10s\t %-10s\t%-10s\t%-10s\t%-10s\t%-10s\t%-s\n";
      fprintf(stderr, header_fmt, "##", "avg. loss", "der. mag.", "d. m. cond.", "wolfe1", "wolfe2", "mix fraction",
          "curvature", "dir. magnitude", "step size");
      cerr.precision(5);
    }

    if (b.regularizers != nullptr)
      all->l2_lambda = 1;  // To make sure we are adding the regularization
    b.output_regularizer = (all->per_feature_regularizer_output != "" || all->per_feature_regularizer_text != "");
    reset_state(*all, b, false);
  }

  // bool reg_vector = b.output_regularizer || all->per_feature_regularizer_input.length() > 0;
  bool reg_vector = (b.output_regularizer && !read) || (all->per_feature_regularizer_input.length() > 0 && read);

  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << ":" << reg_vector << "\n";
    bin_text_read_write_fixed(model_file, (char*)&reg_vector, sizeof(reg_vector), "", read, msg, text);

    if (reg_vector)
      save_load_regularizer(*all, b, model_file, read, text);
    else
      GD::save_load_regressor(*all, model_file, read, text);
  }
}